

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

Privkey * __thiscall
cfd::core::Privkey::CreateTweakMul(Privkey *__return_storage_ptr__,Privkey *this,Privkey *tweak)

{
  ByteData tweak_muled;
  ByteData local_48;
  ByteData256 local_30;
  
  ByteData256::ByteData256(&local_30,&tweak->data_);
  WallyUtil::MulTweakPrivkey(&local_48,&this->data_,&local_30);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Privkey(__return_storage_ptr__,&local_48,kMainnet,true);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateTweakMul(const Privkey &tweak) const {
  ByteData tweak_muled =
      WallyUtil::MulTweakPrivkey(data_, ByteData256(tweak.data_));
  return Privkey(tweak_muled);
}